

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::SectionEntry::listsection(SectionEntry *this,ImgfsFile *imgfs)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  size_t sVar4;
  string local_70;
  string local_50;
  
  if (g_verbose < 2) {
    uVar3 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar2 = this->_nextsection;
    DirEntry::entstring_abi_cxx11_(&local_70,&this->super_DirEntry);
    nameinfo::name_abi_cxx11_(&local_50,&this->_name,imgfs);
    printf("         %08x: n->%08x %9d                        %s %s\n",(ulong)uVar3,(ulong)uVar2,
           (ulong)uVar1,local_70._M_dataplus._M_p,local_50._M_dataplus._M_p);
  }
  else {
    sVar4 = DirEntry::calc_compressed_size(&this->super_DirEntry,imgfs);
    uVar3 = DirEntry::offset(&this->super_DirEntry);
    uVar1 = (this->super_DirEntry)._size;
    uVar2 = this->_nextsection;
    DirEntry::entstring_abi_cxx11_(&local_70,&this->super_DirEntry);
    nameinfo::name_abi_cxx11_(&local_50,&this->_name,imgfs);
    printf("         %08x: n->%08x %9d %9d                       %s %s\n",(ulong)uVar3,(ulong)uVar2,
           (ulong)uVar1,sVar4,local_70._M_dataplus._M_p,local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void listsection(ImgfsFile& imgfs)
        {
            if (g_verbose>1) {
                size_t compsize= calc_compressed_size(imgfs);
                printf("         %08x: n->%08x %9d %9d                       %s %s\n",
                        offset(), _nextsection, _size, int(compsize), entstring().c_str(), _name.name(imgfs).c_str());
            }
            else {
                printf("         %08x: n->%08x %9d                        %s %s\n",
                        offset(), _nextsection, _size, entstring().c_str(), _name.name(imgfs).c_str());
            }
        }